

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

void bcache_init(int nblock,int blocksize,bcache_config *bconfig)

{
  int iVar1;
  undefined1 *in_RDX;
  int in_ESI;
  int in_EDI;
  char *pcVar2;
  long elapsed;
  int rv;
  timeval end;
  timeval begin;
  uint8_t *block_ptr;
  bcache_item *item;
  int i;
  hash_cmp_func *in_stack_ffffffffffffff78;
  fdb_rw_lock *in_stack_ffffffffffffff80;
  __atomic_base<unsigned_char> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  timeval local_50;
  timeval local_40;
  void *local_30;
  undefined8 *local_28;
  int local_1c;
  undefined1 *local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RDX;
  local_10 = in_ESI;
  local_c = in_EDI;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  list_init(&freelist);
  list_init(&file_zombies);
  hash_init((hash *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
            (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
            (hash_hash_func *)in_stack_ffffffffffffff80->__size,in_stack_ffffffffffffff78);
  bcache_blocksize = local_10;
  bcache_flush_unit = 0x100000;
  bcache_nblock = (uint64_t)local_c;
  bcache_global_config.do_not_cache_doc_blocks = (bool)*local_18;
  pthread_spin_init(&bcache_lock,1);
  pthread_spin_init(&freelist_lock,1);
  iVar1 = init_rw_lock(in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    in_stack_ffffffffffffff80 =
         (fdb_rw_lock *)CONCAT44((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),iVar1);
    fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                 ,"bcache_init",0x5a1,
                 "Error in bcache_init(): RW Lock initialization failed; ErrorCode: %d\n");
  }
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (__int_type)in_stack_ffffffffffffff88);
  num_files = 0;
  file_array_capacity = 0x10000;
  file_list = (fnamedic_item **)calloc(0x10000,8);
  buffercache_addr = calloc((long)local_c,(long)bcache_blocksize);
  local_30 = buffercache_addr;
  for (local_1c = 0; local_1c < local_c; local_1c = local_1c + 1) {
    local_28 = (undefined8 *)malloc(0x40);
    *local_28 = 0xffffffffffffffff;
    std::__atomic_base<unsigned_char>::operator=
              (in_stack_ffffffffffffff88,
               (__int_type_conflict)((ulong)in_stack_ffffffffffffff80 >> 0x38));
    *(undefined1 *)((long)local_28 + 0x39) = 0;
    local_28[1] = local_30;
    local_30 = (void *)((long)local_30 + (long)bcache_blocksize);
    list_push_front(&freelist,(list_elem *)(local_28 + 5));
    std::__atomic_base<unsigned_long>::operator++
              (&freelist_count.super___atomic_base<unsigned_long>,0);
  }
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  pcVar2 = "SECOND CHANCE";
  if ((bcache_global_config.do_not_cache_doc_blocks & 1U) != 0) {
    pcVar2 = "DO NOT CACHE DOC BLOCKS";
  }
  fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
               ,"bcache_init",0x5c4,
               "Forestdb blockcache size %lu cache %s, num buckets per file %zu, initialized in %ld us\n"
               ,(long)bcache_blocksize * (long)local_c,pcVar2,0x101,
               (local_50.tv_sec - local_40.tv_sec) * 1000000 + (local_50.tv_usec - local_40.tv_usec)
              );
  return;
}

Assistant:

void bcache_init(int nblock, int blocksize, const bcache_config& bconfig)
{
    int i;
    struct bcache_item *item;
    uint8_t *block_ptr;
    struct timeval begin, end;
    gettimeofday(&begin, NULL);

    list_init(&freelist);
    list_init(&file_zombies);

    hash_init(&fnamedic, BCACHE_NDICBUCKET, _fname_hash, _fname_cmp);

    bcache_blocksize = blocksize;
    bcache_flush_unit = BCACHE_FLUSH_UNIT;
    bcache_nblock = nblock;
    bcache_global_config = bconfig;
    spin_init(&bcache_lock);
    spin_init(&freelist_lock);

    int rv = init_rw_lock(&filelist_lock);
    if (rv != 0) {
        fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                "Error in bcache_init(): "
                "RW Lock initialization failed; ErrorCode: %d\n", rv);
    }

    freelist_count = 0;

    num_files = 0;
    file_array_capacity = 65536; // Initial capacity of file list array.
    file_list = (fnamedic_item **) calloc(file_array_capacity, sizeof(fnamedic_item *));
    // Allocate entire buffer cache memory
    block_ptr = (uint8_t *)calloc(nblock, (uint64_t)bcache_blocksize);
    buffercache_addr = block_ptr;

    for (i=0;i<nblock;++i){
        item = (struct bcache_item *)malloc(sizeof(struct bcache_item));

        item->bid = BLK_NOT_FOUND;
        item->flag = 0x0 | BCACHE_FREE;
        item->score = 0;
        item->addr = block_ptr;
        block_ptr += bcache_blocksize;

        list_push_front(&freelist, &item->list_elem);
        freelist_count++;
    }

    gettimeofday(&end, NULL);
    long elapsed = (end.tv_sec - begin.tv_sec) * 1000000 + (end.tv_usec - begin.tv_usec);
    fdb_log(NULL, FDB_LOG_INFO, FDB_RESULT_SUCCESS,
            "Forestdb blockcache size %" _F64
            " cache %s, num buckets per file %zu, initialized in %ld us\n",
            (uint64_t)bcache_blocksize * nblock,
            ( bcache_global_config.do_not_cache_doc_blocks
              ? "DO NOT CACHE DOC BLOCKS"
              : "SECOND CHANCE" ),
            BCACHE_NBUCKET,
            elapsed);
}